

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_connection.hpp
# Opt level: O2

Lazy<bool> __thiscall
cinatra::coro_http_connection::write_multipart
          (coro_http_connection *this,string_view part_data,string_view content_type)

{
  implementation_type *piVar1;
  element_type *peVar2;
  undefined8 in_R9;
  
  peVar2 = (element_type *)operator_new(0xb0,(nothrow_t *)&std::nothrow);
  if (peVar2 == (element_type *)0x0) {
    (this->super_enable_shared_from_this<cinatra::coro_http_connection>)._M_weak_this.
    super___weak_ptr<cinatra::coro_http_connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
  }
  else {
    *(code **)&(peVar2->super_enable_shared_from_this<cinatra::coro_http_connection>)._M_weak_this.
               super___weak_ptr<cinatra::coro_http_connection,_(__gnu_cxx::_Lock_policy)2> =
         write_multipart;
    ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
    ((long)&(peVar2->super_enable_shared_from_this<cinatra::coro_http_connection>)._M_weak_this.
            super___weak_ptr<cinatra::coro_http_connection,_(__gnu_cxx::_Lock_policy)2> + 8))->_M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)write_multipart;
    *(size_t *)&(peVar2->head_buf_).field_0x28 = content_type._M_len;
    *(char **)&(peVar2->head_buf_).field_0x20 = part_data._M_str;
    *(size_t *)&(peVar2->head_buf_).field_0x18 = part_data._M_len;
    peVar2->router_ = (coro_http_router *)content_type._M_str;
    *(undefined8 *)&peVar2->head_buf_ = in_R9;
    peVar2->executor_ =
         (ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_> *)0x0;
    (peVar2->socket_).super_basic_socket<asio::ip::tcp,_asio::any_io_executor>.impl_.service_ =
         (service_type *)0x0;
    piVar1 = (implementation_type *)
             ((long)&(peVar2->socket_).super_basic_socket<asio::ip::tcp,_asio::any_io_executor>.
                     impl_ + 8);
    (piVar1->super_base_implementation_type).socket_ = 0;
    (piVar1->super_base_implementation_type).state_ = '\0';
    *(undefined3 *)&(piVar1->super_base_implementation_type).field_0x5 = 0;
    *(undefined1 *)
     &((protocol_type *)
      ((long)&(peVar2->socket_).super_basic_socket<asio::ip::tcp,_asio::any_io_executor>.impl_ +
      0x18))->family_ = 0;
    (this->super_enable_shared_from_this<cinatra::coro_http_connection>)._M_weak_this.
    super___weak_ptr<cinatra::coro_http_connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
    (peVar2->head_buf_).field_0x30 = 0;
  }
  return (LazyBase<bool,_false>)(LazyBase<bool,_false>)this;
}

Assistant:

async_simple::coro::Lazy<bool> write_multipart(
      std::string_view part_data, std::string_view content_type) {
    response_.set_delay(true);
    buffers_.clear();
    std::string part_head = "--";
    part_head.append(response_.get_boundary()).append(CRCF);
    part_head.append("Content-Type: ").append(content_type).append(CRCF);
    part_head.append("Content-Length: ")
        .append(std::to_string(part_data.size()))
        .append(TWO_CRCF);

    buffers_.push_back(asio::buffer(part_head));
    buffers_.push_back(asio::buffer(part_data));
    buffers_.push_back(asio::buffer(CRCF));

    auto [ec, _] = co_await async_write(buffers_);
    co_return !ec;
  }